

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O2

void Fra_FraigNode(Fra_Man_t *p,Aig_Obj_t *pObj)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  void **ppvVar5;
  Aig_Obj_t *pNew;
  Aig_Obj_t *pOld;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                  ,0xee,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
  }
  pvVar1 = (pObj->field_5).pData;
  pAVar2 = *(Aig_Obj_t **)(*(long *)(*(long *)((long)pvVar1 + 0x30) + 8) + (long)pObj->Id * 8);
  if ((pAVar2 != (Aig_Obj_t *)0x0) &&
     ((p->pPars->fDoSparse != 0 || (pAVar2 != p->pManAig->pConst1)))) {
    iVar4 = p->pPars->nFramesK;
    uVar3 = *(ulong *)(*(long *)((long)(pAVar2->field_5).pData + 0x20) +
                      (long)(pAVar2->Id * *(int *)((long)(pAVar2->field_5).pData + 0x18) + iVar4) *
                      8);
    pNew = (Aig_Obj_t *)
           (*(ulong *)(*(long *)((long)pvVar1 + 0x20) +
                      (long)(pObj->Id * *(int *)((long)pvVar1 + 0x18) + iVar4) * 8) &
           0xfffffffffffffffe);
    pOld = (Aig_Obj_t *)(uVar3 & 0xfffffffffffffffe);
    if (pNew == pOld) {
      p->nSatCallsSkipped = p->nSatCallsSkipped + 1;
    }
    else {
      if ((iVar4 == 0) && (p->pManFraig->pConst1 == pNew)) {
        __assert_fail("p->pPars->nFramesK || Aig_Regular(pObjFraig) != Aig_ManConst1(p->pManFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                      ,0xfe,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
      }
      iVar4 = Fra_NodesAreEquiv(p,pOld,pNew);
      if (iVar4 == -1) {
        p_00 = p->vTimeouts;
        if (p_00 == (Vec_Ptr_t *)0x0) {
          p_00 = (Vec_Ptr_t *)malloc(0x10);
          p_00->nCap = 100;
          p_00->nSize = 0;
          ppvVar5 = (void **)malloc(800);
          p_00->pArray = ppvVar5;
          p->vTimeouts = p_00;
        }
        Vec_PtrPush(p_00,pObj);
        if (p->pPars->fSpeculate != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                        ,0x111,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
        }
      }
      else if (iVar4 == 1) {
        *(ulong *)(*(long *)((long)(pObj->field_5).pData + 0x20) +
                  ((long)pObj->Id * (long)*(int *)((long)(pObj->field_5).pData + 0x18) +
                  (long)p->pPars->nFramesK) * 8) =
             (*(uint *)&pAVar2->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1 ^ uVar3;
      }
      else {
        p->pCla->fRefinement = 1;
        if (p->vTimeouts != (Vec_Ptr_t *)0x0) {
          Vec_PtrPush(p->vTimeouts,pObj);
        }
        Fra_SmlResimulate(p);
        if ((p->pManFraig->pData == (void *)0x0) && (p->pPars->nFramesK == 0)) {
          if ((*(Aig_Obj_t **)
                (*(long *)(*(long *)((long)(pObj->field_5).pData + 0x30) + 8) + (long)pObj->Id * 8)
               == pAVar2) &&
             (puts("Fra_FraigNode(): Error in class refinement!"), p->pPars->nFramesK != 0)) {
            return;
          }
          if (*(Aig_Obj_t **)
               (*(long *)(*(long *)((long)(pObj->field_5).pData + 0x30) + 8) + (long)pObj->Id * 8)
              == pAVar2) {
            __assert_fail("p->pPars->nFramesK || Fra_ClassObjRepr(pObj) != pObjRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                          ,0x128,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Fra_FraigNode( Fra_Man_t * p, Aig_Obj_t * pObj )
{ 
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    assert( !Aig_IsComplement(pObj) );
    // get representative of this class
    pObjRepr = Fra_ClassObjRepr( pObj );
    if ( pObjRepr == NULL || // this is a unique node
       (!p->pPars->fDoSparse && pObjRepr == Aig_ManConst1(p->pManAig)) ) // this is a sparse node
        return;
    // get the fraiged node
    pObjFraig = Fra_ObjFraig( pObj, p->pPars->nFramesK );
    // get the fraiged representative
    pObjReprFraig = Fra_ObjFraig( pObjRepr, p->pPars->nFramesK );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
    {
        p->nSatCallsSkipped++;
        return;
    }
    assert( p->pPars->nFramesK || Aig_Regular(pObjFraig) != Aig_ManConst1(p->pManFraig) );
    // if they are proved different, the c-ex will be in p->pPatWords
    RetValue = Fra_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
//        if ( p->pPars->fChoicing )
//            Aig_ObjCreateRepr( p->pManFraig, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
        // the nodes proved equal
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjFraig2 );
        return;
    }
    if ( RetValue == -1 ) // failed
    {
        if ( p->vTimeouts == NULL )
            p->vTimeouts = Vec_PtrAlloc( 100 );
        Vec_PtrPush( p->vTimeouts, pObj );
        if ( !p->pPars->fSpeculate )
            return;
        assert( 0 );
        // speculate
        p->nSpeculs++;
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjFraig2 );
        Fra_FraigNodeSpeculate( p, pObj, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
        return;
    }
    // disprove the nodes
    p->pCla->fRefinement = 1;
    // if we do not include the node into those disproved, we may end up 
    // merging this node with another representative, for which proof has timed out
    if ( p->vTimeouts )
        Vec_PtrPush( p->vTimeouts, pObj );
    // verify that the counter-example satisfies all the constraints
//    if ( p->vCex )
//        Fra_FraigVerifyCounterEx( p, p->vCex );
    // simulate the counter-example and return the Fraig node
    Fra_SmlResimulate( p );
    if ( p->pManFraig->pData )
        return;
    if ( !p->pPars->nFramesK && Fra_ClassObjRepr(pObj) == pObjRepr )
        printf( "Fra_FraigNode(): Error in class refinement!\n" );
    assert( p->pPars->nFramesK || Fra_ClassObjRepr(pObj) != pObjRepr );
}